

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O1

bool __thiscall
GlobOpt::OptConstPeep(GlobOpt *this,Instr *instr,Opnd *constSrc,Value **pDstVal,ValueInfo *valuInfo)

{
  byte bVar1;
  OpCode OVar2;
  code *pcVar3;
  Opnd *pOVar4;
  bool bVar5;
  OpndKind OVar6;
  OpndKind OVar7;
  uint uVar8;
  undefined4 *puVar9;
  Opnd *pOVar10;
  _func_int **pp_Var11;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_36;
  int local_34;
  
  pOVar10 = instr->m_src1;
  if (pOVar10 == constSrc) {
    pOVar10 = instr->m_src2;
  }
  bVar5 = ValueInfo::TryGetIntConstantValue(valuInfo,&local_34,false);
  if (!bVar5) {
    OVar6 = IR::Opnd::GetKind(constSrc);
    OVar7 = IR::Opnd::GetKind(constSrc);
    if (OVar6 == OpndKindAddr) {
      if (OVar7 != OpndKindAddr) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar9 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x18e,"(this->IsAddrOpnd())","Bad call to AsAddrOpnd()");
        if (!bVar5) goto LAB_0046075e;
        *puVar9 = 0;
      }
      bVar1 = *(byte *)((long)&constSrc[2].m_valueType.field_0.bits + 1);
      if (((bVar1 != 1) && (bVar1 != 10)) &&
         ((_func_int **)(long)(int)constSrc[2]._vptr_Opnd != constSrc[2]._vptr_Opnd)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar9 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                           ,0x195b,
                           "(addrOpnd->IsVar() || Math::FitsInDWord((size_t)addrOpnd->m_address))",
                           "addrOpnd->IsVar() || Math::FitsInDWord((size_t)addrOpnd->m_address)");
        if (!bVar5) goto LAB_0046075e;
        *puVar9 = 0;
      }
      bVar1 = *(byte *)((long)&constSrc[2].m_valueType.field_0.bits + 1);
      if ((bVar1 == 10) || (bVar1 == 1)) {
        pp_Var11 = constSrc[2]._vptr_Opnd;
        if (((ulong)pp_Var11 & 0x1ffff00000000) != 0x1000000000000 &&
            ((ulong)pp_Var11 & 0xffff000000000000) == 0x1000000000000) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar9 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/Language/TaggedInt.inl"
                             ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                             "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
          if (!bVar5) goto LAB_0046075e;
          *puVar9 = 0;
        }
        if (((ulong)pp_Var11 & 0xffff000000000000) != 0x1000000000000) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar9 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/Language/TaggedInt.inl"
                             ,0x43,"(Is(aValue))","Ensure var is actually a \'TaggedInt\'");
          if (!bVar5) goto LAB_0046075e;
          *puVar9 = 0;
        }
      }
      else {
        OVar6 = IR::Opnd::GetKind(constSrc);
        if (OVar6 != OpndKindAddr) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar9 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                             ,0x18e,"(this->IsAddrOpnd())","Bad call to AsAddrOpnd()");
          if (!bVar5) goto LAB_0046075e;
          *puVar9 = 0;
        }
        uVar8 = Math::PointerCastToIntegral<int>(constSrc[2]._vptr_Opnd);
        pp_Var11 = (_func_int **)(ulong)uVar8;
      }
      local_34 = (int)pp_Var11;
    }
    else {
      if (OVar7 != OpndKindIntConst) {
        return false;
      }
      OVar6 = IR::Opnd::GetKind(constSrc);
      if (OVar6 != OpndKindIntConst) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar9 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0xc0,"(this->IsIntConstOpnd())","Bad call to AsIntConstOpnd()");
        if (!bVar5) goto LAB_0046075e;
        *puVar9 = 0;
      }
      local_34 = IR::IntConstOpnd::AsInt32((IntConstOpnd *)constSrc);
    }
  }
  OVar2 = instr->m_opcode;
  if (OVar2 < Add_I4) {
    if (OVar2 != Add_A) {
      if (OVar2 == Div_A) {
        if (local_34 != 1) {
          return false;
        }
        goto LAB_004606a6;
      }
      if (OVar2 != Mul_A) {
        return false;
      }
      goto switchD_0046060f_caseD_1c2;
    }
    local_36 = (pOVar10->m_valueType).field_0;
    bVar5 = ValueType::IsInt((ValueType *)&local_36.field_0);
    if (!bVar5) {
      return false;
    }
    if (local_34 != 0) {
      return false;
    }
LAB_00460691:
    pOVar10 = instr->m_src1;
    if (instr->m_src1 == constSrc) {
      pOVar10 = instr->m_src2;
    }
    goto LAB_004606b7;
  }
  switch(OVar2) {
  case Add_I4:
    if (local_34 != 0) {
      return false;
    }
    goto LAB_00460691;
  default:
    goto switchD_0046060f_caseD_1c1;
  case Mul_I4:
switchD_0046060f_caseD_1c2:
    if (local_34 != 1) {
      return false;
    }
    break;
  case And_I4:
    pOVar4 = pOVar10;
    goto joined_r0x00460647;
  case Or_I4:
    pOVar4 = constSrc;
    constSrc = pOVar10;
joined_r0x00460647:
    pOVar10 = pOVar4;
    if ((local_34 != -1) && (pOVar10 = constSrc, local_34 != 0)) {
switchD_0046060f_caseD_1c1:
      return false;
    }
    break;
  case Shl_I4:
  case Shr_I4:
  case ShrU_I4:
    if (local_34 != 0) {
      return false;
    }
LAB_004606a6:
    if (instr->m_src2 != constSrc) {
      return false;
    }
    pOVar10 = instr->m_src1;
  }
LAB_004606b7:
  CaptureByteCodeSymUses(this,instr);
  if (pOVar10 == instr->m_src1) {
    IR::Instr::FreeSrc2(instr);
  }
  else {
    if (pOVar10 != instr->m_src2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar9 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x19e1,"(src == instr->GetSrc2())","src == instr->GetSrc2()");
      if (!bVar5) {
LAB_0046075e:
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar9 = 0;
    }
    pOVar10 = IR::Instr::UnlinkSrc2(instr);
    IR::Instr::ReplaceSrc1(instr,pOVar10);
  }
  instr->m_opcode = Ld_A;
  InvalidateInductionVariables(this,instr);
  return true;
}

Assistant:

bool
GlobOpt::OptConstPeep(IR::Instr *instr, IR::Opnd *constSrc, Value **pDstVal, ValueInfo *valuInfo)
{
    int32 value;
    IR::Opnd *src;
    IR::Opnd *nonConstSrc = (constSrc == instr->GetSrc1() ? instr->GetSrc2() : instr->GetSrc1());

    // Try to find the value from value info first
    if (valuInfo->TryGetIntConstantValue(&value))
    {
    }
    else if (constSrc->IsAddrOpnd())
    {
        IR::AddrOpnd *addrOpnd = constSrc->AsAddrOpnd();
#ifdef _M_X64
        Assert(addrOpnd->IsVar() || Math::FitsInDWord((size_t)addrOpnd->m_address));
#else
        Assert(sizeof(value) == sizeof(addrOpnd->m_address));
#endif

        if (addrOpnd->IsVar())
        {
            value = Js::TaggedInt::ToInt32(addrOpnd->m_address);
        }
        else
        {
            // We asserted that the address will fit in a DWORD above
            value = ::Math::PointerCastToIntegral<int32>(constSrc->AsAddrOpnd()->m_address);
        }
    }
    else if (constSrc->IsIntConstOpnd())
    {
        value = constSrc->AsIntConstOpnd()->AsInt32();
    }
    else
    {
        return false;
    }

    switch(instr->m_opcode)
    {
        // Can't do all Add_A because of string concats.
        // Sub_A cannot be transformed to a NEG_A because 0 - 0 != -0
    case Js::OpCode::Add_A:
        src = nonConstSrc;

        if (!src->GetValueType().IsInt())
        {
            // 0 + -0  != -0
            // "Foo" + 0 != "Foo
            return false;
        }
        // fall-through

    case Js::OpCode::Add_I4:
        if (value != 0)
        {
            return false;
        }
        if (constSrc == instr->GetSrc1())
        {
            src = instr->GetSrc2();
        }
        else
        {
            src = instr->GetSrc1();
        }
        break;

    case Js::OpCode::Mul_A:
    case Js::OpCode::Mul_I4:
        if (value == 0)
        {
            // -0 * 0 != 0
            return false;
        }
        else if (value == 1)
        {
            src = nonConstSrc;
        }
        else
        {
            return false;
        }
        break;

    case Js::OpCode::Div_A:
        if (value == 1 && constSrc == instr->GetSrc2())
        {
            src = instr->GetSrc1();
        }
        else
        {
            return false;
        }
        break;

    case Js::OpCode::Or_I4:
        if (value == -1)
        {
            src = constSrc;
        }
        else if (value == 0)
        {
            src = nonConstSrc;
        }
        else
        {
            return false;
        }
        break;

    case Js::OpCode::And_I4:
        if (value == -1)
        {
            src = nonConstSrc;
        }
        else if (value == 0)
        {
            src = constSrc;
        }
        else
        {
            return false;
        }
        break;

    case Js::OpCode::Shl_I4:
    case Js::OpCode::ShrU_I4:
    case Js::OpCode::Shr_I4:
        if (value != 0 || constSrc != instr->GetSrc2())
        {
            return false;
        }
        src = instr->GetSrc1();
        break;

    default:
        return false;
    }

    this->CaptureByteCodeSymUses(instr);

    if (src == instr->GetSrc1())
    {
        instr->FreeSrc2();
    }
    else
    {
        Assert(src == instr->GetSrc2());
        instr->ReplaceSrc1(instr->UnlinkSrc2());
    }

    instr->m_opcode = Js::OpCode::Ld_A;

    InvalidateInductionVariables(instr);

    return true;
}